

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O3

Mvc_Cube_t *
Mvc_CoverSort_rec(Mvc_Cube_t *pList,int nItems,Mvc_Cube_t *pMask,
                 _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int iVar1;
  Mvc_Cube_t *pList1;
  Mvc_Cube_t *pMVar2;
  int nItems_00;
  
  if (nItems != 1) {
    nItems_00 = nItems / 2;
    pMVar2 = pList;
    iVar1 = nItems_00;
    if (1 < nItems) {
      do {
        pMVar2 = pMVar2->pNext;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    pList1 = Mvc_CoverSort_rec(pList,nItems_00,pMask,pCompareFunc);
    pMVar2 = Mvc_CoverSort_rec(pMVar2,nItems - nItems_00,pMask,pCompareFunc);
    pMVar2 = Mvc_CoverSortMerge(pList1,pMVar2,pMask,pCompareFunc);
    return pMVar2;
  }
  pList->pNext = (Mvc_Cube_t *)0x0;
  return pList;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSort_rec( Mvc_Cube_t * pList, int nItems, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList1, * pList2;
    int nItems1, nItems2, i;

    // trivial case
    if ( nItems == 1 )
    {
        Mvc_CubeSetNext( pList, NULL );
        return pList;
    }

    // select the new sizes
    nItems1 = nItems/2;
    nItems2 = nItems - nItems1;

    // set the new beginnings
    pList1 = pList2 = pList;
    for ( i = 0; i < nItems1; i++ )
        pList2 = Mvc_CubeReadNext( pList2 );

    // solve recursively
    pList1 = Mvc_CoverSort_rec( pList1, nItems1, pMask, pCompareFunc );
    pList2 = Mvc_CoverSort_rec( pList2, nItems2, pMask, pCompareFunc );

    // merge
    return Mvc_CoverSortMerge( pList1, pList2, pMask, pCompareFunc );
}